

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

cmListFileBacktrace __thiscall cmListFileBacktrace::Pop(cmListFileBacktrace *this)

{
  long lVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long *in_RSI;
  cmListFileBacktrace cVar4;
  
  lVar1 = *in_RSI;
  if (lVar1 == 0) {
    __assert_fail("this->TopEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                  ,0x177,"cmListFileBacktrace cmListFileBacktrace::Pop() const");
  }
  peVar2 = *(element_type **)(lVar1 + 0x48);
  if (peVar2 != (element_type *)0x0) {
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x50);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    (this->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
    ;
    (this->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = in_RDX._M_pi;
    cVar4.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (cmListFileBacktrace)
           cVar4.TopEntry.
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("!this->TopEntry->IsBottom()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                ,0x178,"cmListFileBacktrace cmListFileBacktrace::Pop() const");
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Pop() const
{
  assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom());
  return cmListFileBacktrace(this->TopEntry->Parent);
}